

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowStackToolWindow(bool *p_open)

{
  char *pcVar1;
  bool bVar2;
  ImU32 color;
  ImGuiWindow *pIVar3;
  undefined1 *puVar4;
  ImGuiStackLevelInfo *pIVar5;
  ImGuiStackLevelInfo *pIVar6;
  float fVar7;
  ImVec2 IVar8;
  uint local_198;
  bool local_193;
  ImGuiStackLevelInfo *info;
  float fStack_180;
  int n_1;
  float id_width;
  int local_16c;
  char local_168 [4];
  int n;
  char level_desc [256];
  int local_5c;
  int stack_n;
  char *p_end;
  char *p;
  float local_34;
  uint local_30;
  float time_since_copy;
  ImGuiID active_id;
  ImGuiID hovered_id;
  ImGuiStackTool *tool;
  ImGuiContext *local_18;
  ImGuiContext *g;
  bool *p_open_local;
  
  local_18 = GImGui;
  g = (ImGuiContext *)p_open;
  if (((GImGui->NextWindowData).Flags & 2U) == 0) {
    fVar7 = GetFontSize();
    ImVec2::ImVec2((ImVec2 *)&tool,0.0,fVar7 * 8.0);
    SetNextWindowSize((ImVec2 *)&tool,4);
  }
  bVar2 = Begin("Dear ImGui Stack Tool",&g->Initialized,0);
  if ((bVar2) && (pIVar3 = GetCurrentWindow(), pIVar3->BeginCount < 2)) {
    _active_id = &local_18->DebugStackTool;
    time_since_copy = (float)local_18->HoveredIdPreviousFrame;
    local_30 = local_18->ActiveId;
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X",(ulong)(uint)time_since_copy,(ulong)local_30);
    SameLine(0.0,-1.0);
    MetricsHelpMarker(
                     "Hover an item with the mouse to display elements of the ID Stack leading to the item\'s final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details."
                     );
    local_34 = (float)local_18->Time - _active_id->CopyToClipboardLastTime;
    Checkbox("Ctrl+C: copy path to clipboard",&_active_id->CopyToClipboardOnCtrlC);
    SameLine(0.0,-1.0);
    if (((local_34 < 0.0) || (0.75 <= local_34)) || (fVar7 = fmodf(local_34,0.25), 0.125 <= fVar7))
    {
      ImVec4::ImVec4((ImVec4 *)((long)&p + 4));
    }
    else {
      ImVec4::ImVec4((ImVec4 *)((long)&p + 4),1.0,1.0,0.3,1.0);
    }
    TextColored((ImVec4 *)((long)&p + 4),"*COPIED*");
    if ((((_active_id->CopyToClipboardOnCtrlC & 1U) != 0) && (bVar2 = IsKeyDown(0x281), bVar2)) &&
       (bVar2 = IsKeyPressed(0x224,true), bVar2)) {
      _active_id->CopyToClipboardLastTime = (float)local_18->Time;
      p_end = local_18->TempBuffer;
      puVar4 = &local_18->field_0x6449;
      for (local_5c = 0; local_5c < (_active_id->Results).Size && p_end + 3 < puVar4;
          local_5c = local_5c + 1) {
        *p_end = '/';
        StackToolFormatLevelInfo(_active_id,local_5c,false,local_168,0x100);
        local_16c = 0;
        pcVar1 = p_end;
        while (p_end = pcVar1 + 1, local_168[local_16c] != '\0' && pcVar1 + 3 < puVar4) {
          if (local_168[local_16c] == '/') {
            *p_end = '\\';
            p_end = pcVar1 + 2;
          }
          *p_end = local_168[local_16c];
          local_16c = local_16c + 1;
          pcVar1 = p_end;
        }
      }
      *p_end = '\0';
      SetClipboardText(local_18->TempBuffer);
    }
    _active_id->LastActiveFrame = local_18->FrameCount;
    local_193 = false;
    if (0 < (_active_id->Results).Size) {
      ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe8c,0.0,0.0);
      local_193 = BeginTable("##table",3,0x780,(ImVec2 *)&stack0xfffffffffffffe8c,0.0);
    }
    if (local_193 != false) {
      IVar8 = CalcTextSize("0xDDDDDDDD",(char *)0x0,false,-1.0);
      fStack_180 = IVar8.x;
      TableSetupColumn("Seed",0x10,fStack_180,0);
      TableSetupColumn("PushID",8,0.0,0);
      TableSetupColumn("Result",0x10,fStack_180,0);
      TableHeadersRow();
      for (info._4_4_ = 0; info._4_4_ < (_active_id->Results).Size; info._4_4_ = info._4_4_ + 1) {
        pIVar5 = ImVector<ImGuiStackLevelInfo>::operator[](&_active_id->Results,info._4_4_);
        TableNextColumn();
        if (info._4_4_ < 1) {
          local_198 = 0;
        }
        else {
          pIVar6 = ImVector<ImGuiStackLevelInfo>::operator[](&_active_id->Results,info._4_4_ + -1);
          local_198 = pIVar6->ID;
        }
        Text("0x%08X",(ulong)local_198);
        TableNextColumn();
        StackToolFormatLevelInfo(_active_id,info._4_4_,true,local_18->TempBuffer,0xc01);
        TextUnformatted(local_18->TempBuffer,(char *)0x0);
        TableNextColumn();
        Text("0x%08X",(ulong)pIVar5->ID);
        if (info._4_4_ == (_active_id->Results).Size + -1) {
          color = GetColorU32(0x18,1.0);
          TableSetBgColor(3,color,-1);
        }
      }
      EndTable();
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowStackToolWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 8.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Stack Tool", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Display hovered/active status
    ImGuiStackTool* tool = &g.DebugStackTool;
    const ImGuiID hovered_id = g.HoveredIdPreviousFrame;
    const ImGuiID active_id = g.ActiveId;
#ifdef IMGUI_ENABLE_TEST_ENGINE
    Text("HoveredId: 0x%08X (\"%s\"), ActiveId:  0x%08X (\"%s\")", hovered_id, hovered_id ? ImGuiTestEngine_FindItemDebugLabel(&g, hovered_id) : "", active_id, active_id ? ImGuiTestEngine_FindItemDebugLabel(&g, active_id) : "");
#else
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X", hovered_id, active_id);
#endif
    SameLine();
    MetricsHelpMarker("Hover an item with the mouse to display elements of the ID Stack leading to the item's final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details.");

    // CTRL+C to copy path
    const float time_since_copy = (float)g.Time - tool->CopyToClipboardLastTime;
    Checkbox("Ctrl+C: copy path to clipboard", &tool->CopyToClipboardOnCtrlC);
    SameLine();
    TextColored((time_since_copy >= 0.0f && time_since_copy < 0.75f && ImFmod(time_since_copy, 0.25f) < 0.25f * 0.5f) ? ImVec4(1.f, 1.f, 0.3f, 1.f) : ImVec4(), "*COPIED*");
    if (tool->CopyToClipboardOnCtrlC && IsKeyDown(ImGuiKey_ModCtrl) && IsKeyPressed(ImGuiKey_C))
    {
        tool->CopyToClipboardLastTime = (float)g.Time;
        char* p = g.TempBuffer;
        char* p_end = p + IM_ARRAYSIZE(g.TempBuffer);
        for (int stack_n = 0; stack_n < tool->Results.Size && p + 3 < p_end; stack_n++)
        {
            *p++ = '/';
            char level_desc[256];
            StackToolFormatLevelInfo(tool, stack_n, false, level_desc, IM_ARRAYSIZE(level_desc));
            for (int n = 0; level_desc[n] && p + 2 < p_end; n++)
            {
                if (level_desc[n] == '/')
                    *p++ = '\\';
                *p++ = level_desc[n];
            }
        }
        *p = '\0';
        SetClipboardText(g.TempBuffer);
    }

    // Display decorated stack
    tool->LastActiveFrame = g.FrameCount;
    if (tool->Results.Size > 0 && BeginTable("##table", 3, ImGuiTableFlags_Borders))
    {
        const float id_width = CalcTextSize("0xDDDDDDDD").x;
        TableSetupColumn("Seed", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableSetupColumn("PushID", ImGuiTableColumnFlags_WidthStretch);
        TableSetupColumn("Result", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableHeadersRow();
        for (int n = 0; n < tool->Results.Size; n++)
        {
            ImGuiStackLevelInfo* info = &tool->Results[n];
            TableNextColumn();
            Text("0x%08X", (n > 0) ? tool->Results[n - 1].ID : 0);
            TableNextColumn();
            StackToolFormatLevelInfo(tool, n, true, g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer));
            TextUnformatted(g.TempBuffer);
            TableNextColumn();
            Text("0x%08X", info->ID);
            if (n == tool->Results.Size - 1)
                TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_Header));
        }
        EndTable();
    }
    End();
}